

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_h_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int i;
  uint16_t *in_stack_00000068;
  ptrdiff_t in_stack_00000070;
  uint16_t *in_stack_00000078;
  undefined4 local_28;
  
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    h_predictor_16x8(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void aom_highbd_h_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  int i;
  (void)above;
  (void)bd;

  for (i = 0; i < 4; i++, left += 8) {
    h_predictor_16x8(dst, stride, left);
    dst += stride << 3;
  }
}